

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

string * __thiscall miniros::Connection::getCallerId_abi_cxx11_(Connection *this)

{
  bool bVar1;
  string *in_RSI;
  string *in_RDI;
  string callerid;
  string *key;
  Header *this_00;
  allocator<char> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  undefined1 local_51 [33];
  string local_30 [48];
  
  std::__cxx11::string::string(local_30);
  key = (string *)((long)&in_RSI->field_2 + 8);
  this_00 = (Header *)local_51;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,
             (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             in_stack_ffffffffffffff90);
  bVar1 = Header::getValue(this_00,key,in_RSI);
  std::__cxx11::string::~string((string *)(local_51 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_51);
  if (bVar1) {
    std::__cxx11::string::string((string *)in_RDI,local_30);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,
               (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               in_stack_ffffffffffffff90);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  }
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string Connection::getCallerId()
{
  std::string callerid;
  if (header_.getValue("callerid", callerid))
  {
    return callerid;
  }

  return std::string("unknown");
}